

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O3

void __thiscall merlin::wmb::match_clusters(wmb *this,size_t x,double step)

{
  double dVar1;
  unsigned_long uVar2;
  findex fVar3;
  double dVar4;
  pointer pdVar5;
  size_t sVar6;
  pointer pmVar7;
  pointer puVar8;
  findex *pfVar9;
  ulong uVar10;
  size_type __n;
  long lVar11;
  ulong uVar12;
  vector<merlin::factor,_std::allocator<merlin::factor>_> ftmp;
  variable VX;
  variable_set var;
  factor fmatch;
  factor bel;
  vector<merlin::factor,_std::allocator<merlin::factor>_> local_1b8;
  double local_1a0;
  variable local_198;
  variable_set local_188;
  factor local_150;
  factor local_f0;
  factor local_90;
  
  pmVar7 = (this->m_clusters).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)*(pointer *)
                  ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
           *(long *)&pmVar7[x].super_my_vector<unsigned_long>.
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  if (8 < uVar10) {
    dVar1 = (this->super_graphical_model).m_dims.super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_start[x];
    local_198.m_states = (size_t)dVar1;
    local_198.m_states =
         (long)(dVar1 - 9.223372036854776e+18) & (long)local_198.m_states >> 0x3f |
         local_198.m_states;
    sVar6 = x + 0x3f;
    if (-1 < (long)x) {
      sVar6 = x;
    }
    __n = (long)uVar10 >> 3;
    local_1a0 = step;
    local_198.m_label = x;
    if (((this->m_var_types).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
         [((long)sVar6 >> 6) +
          (ulong)((x & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >> (x & 0x3f)
        & 1) == 0) {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b8,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar7 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar9 = *(findex **)
                &pmVar7[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (pfVar9 != *(pointer *)
                     ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar11 = 0;
        do {
          fVar3 = *pfVar9;
          calc_belief(&local_f0,this,fVar3);
          if (local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            dVar1 = (this->m_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[fVar3];
            uVar10 = 0;
            do {
              pdVar5 = local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar4 = pow(local_f0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar10],1.0 / dVar1);
              pdVar5[uVar10] = dVar4;
              uVar10 = uVar10 + 1;
            } while (uVar10 < (ulong)((long)local_f0.t_.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_f0.t_.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          factor::marginal(&local_90,&local_f0,&local_188);
          factor::operator=(local_1b8.
                            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar11,&local_90);
          factor::~factor(&local_90);
          factor::binaryOp<merlin::factor::binOpPower>
                    (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[fVar3],0),&local_90,
                     local_1b8.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar11);
          factor::binaryOpIP<merlin::factor::binOpTimes>(&local_150,&local_90);
          factor::~factor(&local_90);
          factor::~factor(&local_f0);
          pfVar9 = pfVar9 + 1;
          lVar11 = lVar11 + 1;
          pmVar7 = (this->m_clusters).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (pfVar9 != *(pointer *)
                            ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
        pfVar9 = *(findex **)
                  &pmVar7[x].super_my_vector<unsigned_long>.
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      }
      if (pfVar9 != *(pointer *)
                     ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar11 = 0;
        do {
          fVar3 = *pfVar9;
          factor::binaryOp<merlin::factor::binOpDivide>
                    (&local_90,&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11);
          factor::binaryOp<merlin::factor::binOpPower>
                    (SUB84((this->m_weights).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[fVar3] * local_1a0,0),&local_f0,
                     &local_90);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    ((this->m_reparam).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + fVar3,&local_f0);
          factor::~factor(&local_f0);
          factor::~factor(&local_90);
          pfVar9 = pfVar9 + 1;
          lVar11 = lVar11 + 0x60;
        } while (pfVar9 != *(pointer *)
                            ((long)&(this->m_clusters).
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[x].
                                    super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
    }
    else {
      std::vector<merlin::factor,_std::allocator<merlin::factor>_>::vector
                (&local_1b8,__n,(allocator_type *)&local_150);
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.m_d = (vsize *)0x0;
      variable_set::operator|=(&local_188,&local_198);
      factor::factor(&local_150,&local_188,1.0);
      pmVar7 = (this->m_clusters).
               super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar9 = *(findex **)
                &pmVar7[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (pfVar9 != *(pointer *)
                     ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar11 = 0;
        do {
          calc_belief(&local_f0,this,*pfVar9);
          factor::maxmarginal(&local_90,&local_f0,&local_188);
          factor::operator=((factor *)
                            ((long)&(local_1b8.
                                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor +
                            lVar11),&local_90);
          factor::~factor(&local_90);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    (&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11);
          factor::~factor(&local_f0);
          pfVar9 = pfVar9 + 1;
          pmVar7 = (this->m_clusters).
                   super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x60;
        } while (pfVar9 != *(pointer *)
                            ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
      if (local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          pdVar5 = local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pow(local_150.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12],
                      1.0 / (((double)CONCAT44(0x45300000,(int)((long)uVar10 >> 0x23)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0)));
          pdVar5[uVar12] = dVar1;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)local_150.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_150.t_.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
        pmVar7 = (this->m_clusters).
                 super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      puVar8 = *(pointer *)
                &pmVar7[x].super_my_vector<unsigned_long>.
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (puVar8 != *(pointer *)
                     ((long)&pmVar7[x].super_my_vector<unsigned_long>.
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8))
      {
        lVar11 = 0;
        do {
          uVar2 = *puVar8;
          factor::binaryOp<merlin::factor::binOpDivide>
                    (&local_f0,&local_150,
                     (long)&(local_1b8.
                             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar11);
          factor::binaryOpIP<merlin::factor::binOpTimes>
                    ((this->m_reparam).
                     super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar2,&local_f0);
          factor::~factor(&local_f0);
          puVar8 = puVar8 + 1;
          lVar11 = lVar11 + 0x60;
        } while (puVar8 != *(pointer *)
                            ((long)&(this->m_clusters).
                                    super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[x].
                                    super_my_vector<unsigned_long>.
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            + 8));
      }
    }
    factor::~factor(&local_150);
    variable_set::~variable_set(&local_188);
    std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&local_1b8);
  }
  return;
}

Assistant:

void wmb::match_clusters(size_t x, double step) {

	if (m_clusters[x].size() <= 1) {
		return; // no matching
	}

	variable VX = var(x);
	if (m_var_types[x] == true) { // max marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R); // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);

		size_t i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			ftmp[i] = bel.maxmarginal(var); // max-marginal
			fmatch *= ftmp[i];
		}

		i = 0;
		fmatch ^= (1.0/R); // and match each bucket to it
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= (fmatch/ftmp[i]);
		}

	} else { // weighted marginals matching

		size_t R = m_clusters[x].size();
		std::vector<factor> ftmp(R);   // compute geometric mean

		variable_set var;
		var |= VX; // on mutual variable (bucket variable)
		factor fmatch(var,1.0);
		size_t i = 0;

		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, i++) {

			findex a = (*it);
			factor bel = calc_belief(a);
			bel ^= (1.0/m_weights[a]);
			ftmp[i] = bel.marginal(var);
			fmatch *= (ftmp[i] ^ m_weights[a]);
		}

		i = 0;
		for (flist::const_iterator it = m_clusters[x].begin();
				it != m_clusters[x].end(); ++it, ++i) {
			findex a = (*it);
			m_reparam[a] *= ((fmatch/ftmp[i])^(step*m_weights[a]));
		}
	}
}